

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O0

size_t __thiscall czh::file::NonStreamFile::get_arrowpos(NonStreamFile *this,size_t pos)

{
  const_reference pvVar1;
  int local_1c;
  int i;
  size_t pos_local;
  NonStreamFile *this_local;
  
  local_1c = (int)pos;
  if (pos != 1) {
    local_1c = local_1c + -1;
  }
  for (; pvVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  operator[](&this->code,(long)local_1c), *pvVar1 != '\n' && -1 < local_1c;
      local_1c = local_1c + -1) {
  }
  return pos - (long)local_1c;
}

Assistant:

[[nodiscard]] std::size_t get_arrowpos(std::size_t pos) const override
    {
      int i = static_cast<int>(pos);
      if (pos != 1)
        --i;
      while (code[i] != '\n' && i >= 0)
        --i;
      return pos - i;
    }